

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode
TA_GetInputParameterInfo(TA_FuncHandle *handle,uint paramIndex,TA_InputParameterInfo **info)

{
  TA_InputParameterInfo **inputTable;
  TA_FuncInfo *funcInfo;
  TA_FuncDef *funcDef;
  TA_InputParameterInfo **info_local;
  uint paramIndex_local;
  TA_FuncHandle *handle_local;
  
  if ((handle == (TA_FuncHandle *)0x0) || (info == (TA_InputParameterInfo **)0x0)) {
    handle_local._4_4_ = TA_BAD_PARAM;
  }
  else {
    *info = (TA_InputParameterInfo *)0x0;
    if (*handle == 0xa201b201) {
      if (*(long *)(handle + 2) == 0) {
        handle_local._4_4_ = TA_INVALID_HANDLE;
      }
      else if (paramIndex < *(uint *)(*(long *)(handle + 2) + 0x24)) {
        if (*(long *)(handle + 4) == 0) {
          handle_local._4_4_ = TA_INTERNAL_ERROR|TA_BAD_PARAM;
        }
        else {
          *info = *(TA_InputParameterInfo **)(*(long *)(handle + 4) + (ulong)paramIndex * 8);
          if (*info == (TA_InputParameterInfo *)0x0) {
            handle_local._4_4_ = TA_INTERNAL_ERROR|TA_ALLOC_ERR;
          }
          else {
            handle_local._4_4_ = TA_SUCCESS;
          }
        }
      }
      else {
        handle_local._4_4_ = TA_BAD_PARAM;
      }
    }
    else {
      handle_local._4_4_ = TA_INVALID_HANDLE;
    }
  }
  return handle_local._4_4_;
}

Assistant:

TA_RetCode TA_GetInputParameterInfo( const TA_FuncHandle *handle,
                                     unsigned int paramIndex,
                                     const TA_InputParameterInfo **info )
{
   const TA_FuncDef  *funcDef;
   const TA_FuncInfo *funcInfo;
   const TA_InputParameterInfo **inputTable;

   if( (handle == NULL) || (info == NULL) )
   {
      return TA_BAD_PARAM;
   }

   *info = NULL;

   /* Validate that this is a valid funcHandle. */
   funcDef = (const TA_FuncDef *)handle;
   if( funcDef->magicNumber != TA_FUNC_DEF_MAGIC_NB )
   {
      return TA_INVALID_HANDLE;
   }
   funcInfo = funcDef->funcInfo;

   if( !funcInfo ) return TA_INVALID_HANDLE;

   if( paramIndex >= funcInfo->nbInput )
   {
      return TA_BAD_PARAM;
   }

   inputTable = (const TA_InputParameterInfo **)funcDef->input;

   if( !inputTable )
      return TA_INTERNAL_ERROR(2);

   *info = inputTable[paramIndex];

   if( !(*info) )
      return TA_INTERNAL_ERROR(3);

   return TA_SUCCESS;
}